

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_blob_open(sqlite3 *db,char *zDb,char *zTable,char *zColumn,sqlite_int64 iRow,int wrFlag,
                     sqlite3_blob **ppBlob)

{
  u8 uVar1;
  Schema *pSVar2;
  char *p;
  int iVar3;
  Incrblob *p_00;
  Parse *pParse;
  Table *pTVar4;
  Index *pIVar5;
  Vdbe *p_01;
  FKey *pFVar6;
  VdbeOp *pVVar7;
  sqlite3 *psVar8;
  undefined8 uVar9;
  ulong uVar10;
  Schema **ppSVar11;
  long lVar12;
  char *pcVar13;
  uint uVar14;
  ulong uVar15;
  Column *pCVar16;
  uint uVar17;
  int p1;
  char *zErr;
  char *local_98;
  Table *local_90;
  Incrblob *local_88;
  uint local_80;
  int local_7c;
  Parse *local_78;
  VdbeOp *local_70;
  sqlite3 *local_68;
  char *local_60;
  char *local_58;
  char **local_50;
  undefined8 local_48;
  sqlite_int64 local_40;
  char *local_38;
  
  local_98 = (char *)0x0;
  *ppBlob = (sqlite3_blob *)0x0;
  local_7c = wrFlag;
  local_60 = zTable;
  local_58 = zColumn;
  local_40 = iRow;
  local_38 = zDb;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  p_00 = (Incrblob *)sqlite3DbMallocZero(db,0x38);
  if (p_00 == (Incrblob *)0x0) {
LAB_00115fbf:
    pParse = (Parse *)0x0;
LAB_00115fc1:
    uVar17 = 0;
    if (db->mallocFailed == '\0') {
      *ppBlob = (sqlite3_blob *)p_00;
      pcVar13 = "%s";
      if (local_98 == (char *)0x0) {
        pcVar13 = (char *)0x0;
      }
      uVar17 = 0;
      goto LAB_00116074;
    }
LAB_0011603b:
    if (p_00 != (Incrblob *)0x0) goto LAB_00116043;
  }
  else {
    pParse = (Parse *)sqlite3DbMallocRawNN(db,0x250);
    uVar9 = 0;
    if (pParse == (Parse *)0x0) goto LAB_00115fbf;
    local_50 = &pParse->zErrMsg;
    local_80 = 0;
    local_88 = p_00;
    local_78 = pParse;
    local_68 = db;
    do {
      local_48 = uVar9;
      memset(local_50,0,0x248);
      pParse->db = db;
      sqlite3DbFree(db,local_98);
      local_98 = (char *)0x0;
      if (db->skipBtreeMutex == '\0') {
        btreeEnterAll(db);
      }
      pTVar4 = sqlite3LocateTable(pParse,0,local_60,local_38);
      if (pTVar4 == (Table *)0x0) {
LAB_00116109:
        if (pParse->zErrMsg != (char *)0x0) {
          sqlite3DbFree(db,(void *)0x0);
          local_98 = pParse->zErrMsg;
          pParse->zErrMsg = (char *)0x0;
        }
        uVar17 = 1;
        if (db->skipBtreeMutex == '\0') {
          btreeLeaveAll(db);
        }
        goto LAB_00116043;
      }
      if ((pTVar4->tabFlags & 0x10) != 0) {
        pcVar13 = "cannot open virtual table: %s";
LAB_001160fa:
        sqlite3ErrorMsg(pParse,pcVar13,local_60);
        goto LAB_00116109;
      }
      if ((pTVar4->tabFlags & 0x20) != 0) {
        pcVar13 = "cannot open table without rowid: %s";
        goto LAB_001160fa;
      }
      if (pTVar4->pSelect != (Select *)0x0) {
        pcVar13 = "cannot open view: %s";
        goto LAB_001160fa;
      }
      p_00->pTab = pTVar4;
      if (pTVar4->pSchema == (Schema *)0x0) {
        uVar15 = 0xfff0bdc0;
      }
      else {
        uVar17 = db->nDb;
        if ((int)uVar17 < 1) {
          uVar15 = 0;
        }
        else {
          ppSVar11 = &db->aDb->pSchema;
          uVar10 = 0;
          do {
            uVar15 = uVar10;
            if (*ppSVar11 == pTVar4->pSchema) break;
            uVar10 = uVar10 + 1;
            ppSVar11 = ppSVar11 + 4;
            uVar15 = (ulong)uVar17;
          } while (uVar17 != uVar10);
        }
      }
      p_00->zDb = db->aDb[(int)uVar15].zDbSName;
      uVar17 = (uint)pTVar4->nCol;
      local_90 = pTVar4;
      if ((int)uVar17 < 1) {
        uVar15 = 0;
      }
      else {
        pCVar16 = pTVar4->aCol;
        uVar15 = 0;
        while (iVar3 = sqlite3StrICmp(pCVar16->zName,local_58), iVar3 != 0) {
          uVar15 = uVar15 + 1;
          pCVar16 = pCVar16 + 1;
          if (uVar17 == uVar15) goto LAB_00115feb;
        }
      }
      db = local_68;
      pParse = local_78;
      uVar14 = (uint)uVar15;
      if (uVar14 == uVar17) {
LAB_00115feb:
        db = local_68;
        sqlite3DbFree(local_68,(void *)0x0);
        local_98 = sqlite3MPrintf(db,"no such column: \"%s\"",local_58);
        uVar1 = db->skipBtreeMutex;
        pParse = local_78;
joined_r0x00116178:
        if (uVar1 == '\0') {
          btreeLeaveAll(db);
        }
        uVar17 = 1;
        p_00 = local_88;
        goto LAB_0011603b;
      }
      if (local_7c != 0) {
        if ((local_68->flags & 0x80000) == 0) {
          pcVar13 = (char *)0x0;
        }
        else {
          pcVar13 = (char *)0x0;
          for (pFVar6 = local_90->pFKey; pFVar6 != (FKey *)0x0; pFVar6 = pFVar6->pNextFrom) {
            if (0 < (long)pFVar6->nCol) {
              lVar12 = 0;
              do {
                if (*(uint *)((long)&pFVar6->aCol[0].iFrom + lVar12) == uVar14) {
                  pcVar13 = "foreign key";
                }
                lVar12 = lVar12 + 0x10;
              } while ((long)pFVar6->nCol * 0x10 != lVar12);
            }
          }
        }
        for (pIVar5 = local_90->pIndex; pIVar5 != (Index *)0x0; pIVar5 = pIVar5->pNext) {
          if ((ulong)pIVar5->nKeyCol != 0) {
            uVar10 = 0;
            do {
              if (uVar14 == (int)pIVar5->aiColumn[uVar10]) {
                pcVar13 = "indexed";
              }
              if ((int)pIVar5->aiColumn[uVar10] == 0xfffffffe) {
                pcVar13 = "indexed";
              }
              uVar10 = uVar10 + 1;
            } while (pIVar5->nKeyCol != uVar10);
          }
        }
        if (pcVar13 != (char *)0x0) {
          sqlite3DbFree(local_68,(void *)0x0);
          local_98 = sqlite3MPrintf(db,"cannot open %s column for writing",pcVar13);
          uVar1 = db->skipBtreeMutex;
          goto joined_r0x00116178;
        }
      }
      p_01 = sqlite3VdbeCreate(local_78);
      local_88->pStmt = (sqlite3_stmt *)p_01;
      if (p_01 != (Vdbe *)0x0) {
        pSVar2 = local_90->pSchema;
        if (pSVar2 == (Schema *)0x0) {
          uVar10 = 0xfff0bdc0;
        }
        else {
          uVar17 = db->nDb;
          if ((int)uVar17 < 1) {
            uVar10 = 0;
          }
          else {
            ppSVar11 = &db->aDb->pSchema;
            uVar10 = 0;
            do {
              if (*ppSVar11 == pSVar2) goto LAB_00115dff;
              uVar10 = uVar10 + 1;
              ppSVar11 = ppSVar11 + 4;
            } while (uVar17 != uVar10);
            uVar10 = (ulong)uVar17;
          }
        }
LAB_00115dff:
        local_70 = (VdbeOp *)CONCAT44(local_70._4_4_,pSVar2->iGeneration);
        p1 = (int)uVar10;
        iVar3 = sqlite3VdbeAddOp3(p_01,2,p1,(uint)(wrFlag != 0),pSVar2->schema_cookie);
        psVar8 = p_01->db;
        if (psVar8->mallocFailed == '\0') {
          psVar8 = (sqlite3 *)p_01->aOp;
          *(undefined1 *)((long)psVar8->aLimit + (long)iVar3 * 0x18 + -0x6f) = 0xf5;
          psVar8->aLimit[(long)iVar3 * 6 + -0x18] = (int)local_70;
        }
        if (0 < (long)p_01->nOp) {
          psVar8 = (sqlite3 *)p_01->aOp;
          *(undefined2 *)((long)psVar8 + ((long)p_01->nOp + -1) * 0x18 + 2) = 1;
        }
        pVVar7 = sqlite3VdbeAddOpList(p_01,6,sqlite3_blob_open::openBlob,(int)psVar8);
        uVar17 = 1 << ((byte)uVar10 & 0x1f);
        p_01->btreeMask = p_01->btreeMask | uVar17;
        if ((p1 != 1) && ((p_01->db->aDb[p1].pBt)->sharable != '\0')) {
          p_01->lockMask = p_01->lockMask | uVar17;
        }
        if (db->mallocFailed == '\0') {
          pVVar7->p1 = p1;
          pVVar7->p2 = local_90->tnum;
          pVVar7->p3 = (uint)(wrFlag != 0);
          local_70 = pVVar7;
          sqlite3VdbeChangeP4(p_01,1,local_90->zName,0);
          if (db->mallocFailed == '\0') {
            if (local_7c != 0) {
              local_70[1].opcode = 'i';
            }
            local_70[1].p2 = local_90->tnum;
            local_70[1].p3 = p1;
            local_70[1].p4type = -0xb;
            local_70[1].p4.i = local_90->nCol + 1;
            local_70[3].p2 = (int)local_90->nCol;
            local_78->nVar = 0;
            local_78->nTab = 1;
            local_78->nMem = 1;
            sqlite3VdbeMakeReady(p_01,local_78);
          }
        }
      }
      p_00 = local_88;
      local_88->iCol = (u16)uVar15;
      local_88->db = db;
      if (db->skipBtreeMutex == '\0') {
        btreeLeaveAll(db);
      }
      pParse = local_78;
      uVar17 = (uint)local_48;
      if ((db->mallocFailed != '\0') ||
         (uVar17 = blobSeekToRow(p_00,local_40,&local_98), 0x30 < local_80)) break;
      local_80 = local_80 + 1;
      uVar9 = 0x11;
    } while (uVar17 == 0x11);
    if (uVar17 == 0) goto LAB_00115fc1;
LAB_00116043:
    if ((Vdbe *)p_00->pStmt != (Vdbe *)0x0) {
      sqlite3VdbeFinalize((Vdbe *)p_00->pStmt);
    }
  }
  sqlite3DbFree(db,p_00);
  pcVar13 = "%s";
  if (local_98 == (char *)0x0) {
    pcVar13 = (char *)0x0;
  }
LAB_00116074:
  p = local_98;
  sqlite3ErrorWithMsg(db,uVar17,pcVar13,local_98);
  sqlite3DbFree(db,p);
  sqlite3ParserReset(pParse);
  sqlite3DbFree(db,pParse);
  if ((uVar17 == 0xc0a) || (db->mallocFailed != '\0')) {
    apiOomError(db);
    uVar17 = 7;
  }
  else {
    uVar17 = uVar17 & db->errMask;
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return uVar17;
}

Assistant:

SQLITE_API int sqlite3_blob_open(
  sqlite3* db,            /* The database connection */
  const char *zDb,        /* The attached database containing the blob */
  const char *zTable,     /* The table containing the blob */
  const char *zColumn,    /* The column containing the blob */
  sqlite_int64 iRow,      /* The row containing the glob */
  int wrFlag,             /* True -> read/write access, false -> read-only */
  sqlite3_blob **ppBlob   /* Handle for accessing the blob returned here */
){
  int nAttempt = 0;
  int iCol;               /* Index of zColumn in row-record */
  int rc = SQLITE_OK;
  char *zErr = 0;
  Table *pTab;
  Parse *pParse = 0;
  Incrblob *pBlob = 0;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppBlob==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  *ppBlob = 0;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zTable==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  wrFlag = !!wrFlag;                /* wrFlag = (wrFlag ? 1 : 0); */

  sqlite3_mutex_enter(db->mutex);

  pBlob = (Incrblob *)sqlite3DbMallocZero(db, sizeof(Incrblob));
  if( !pBlob ) goto blob_open_out;
  pParse = sqlite3StackAllocRaw(db, sizeof(*pParse));
  if( !pParse ) goto blob_open_out;

  do {
    memset(pParse, 0, sizeof(Parse));
    pParse->db = db;
    sqlite3DbFree(db, zErr);
    zErr = 0;

    sqlite3BtreeEnterAll(db);
    pTab = sqlite3LocateTable(pParse, 0, zTable, zDb);
    if( pTab && IsVirtual(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open virtual table: %s", zTable);
    }
    if( pTab && !HasRowid(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open table without rowid: %s", zTable);
    }
#ifndef SQLITE_OMIT_VIEW
    if( pTab && pTab->pSelect ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open view: %s", zTable);
    }
#endif
    if( !pTab ){
      if( pParse->zErrMsg ){
        sqlite3DbFree(db, zErr);
        zErr = pParse->zErrMsg;
        pParse->zErrMsg = 0;
      }
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }
    pBlob->pTab = pTab;
    pBlob->zDb = db->aDb[sqlite3SchemaToIndex(db, pTab->pSchema)].zDbSName;

    /* Now search pTab for the exact column. */
    for(iCol=0; iCol<pTab->nCol; iCol++) {
      if( sqlite3StrICmp(pTab->aCol[iCol].zName, zColumn)==0 ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      sqlite3DbFree(db, zErr);
      zErr = sqlite3MPrintf(db, "no such column: \"%s\"", zColumn);
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }

    /* If the value is being opened for writing, check that the
    ** column is not indexed, and that it is not part of a foreign key. 
    */
    if( wrFlag ){
      const char *zFault = 0;
      Index *pIdx;
#ifndef SQLITE_OMIT_FOREIGN_KEY
      if( db->flags&SQLITE_ForeignKeys ){
        /* Check that the column is not part of an FK child key definition. It
        ** is not necessary to check if it is part of a parent key, as parent
        ** key columns must be indexed. The check below will pick up this 
        ** case.  */
        FKey *pFKey;
        for(pFKey=pTab->pFKey; pFKey; pFKey=pFKey->pNextFrom){
          int j;
          for(j=0; j<pFKey->nCol; j++){
            if( pFKey->aCol[j].iFrom==iCol ){
              zFault = "foreign key";
            }
          }
        }
      }
#endif
      for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
        int j;
        for(j=0; j<pIdx->nKeyCol; j++){
          /* FIXME: Be smarter about indexes that use expressions */
          if( pIdx->aiColumn[j]==iCol || pIdx->aiColumn[j]==XN_EXPR ){
            zFault = "indexed";
          }
        }
      }
      if( zFault ){
        sqlite3DbFree(db, zErr);
        zErr = sqlite3MPrintf(db, "cannot open %s column for writing", zFault);
        rc = SQLITE_ERROR;
        sqlite3BtreeLeaveAll(db);
        goto blob_open_out;
      }
    }

    pBlob->pStmt = (sqlite3_stmt *)sqlite3VdbeCreate(pParse);
    assert( pBlob->pStmt || db->mallocFailed );
    if( pBlob->pStmt ){
      
      /* This VDBE program seeks a btree cursor to the identified 
      ** db/table/row entry. The reason for using a vdbe program instead
      ** of writing code to use the b-tree layer directly is that the
      ** vdbe program will take advantage of the various transaction,
      ** locking and error handling infrastructure built into the vdbe.
      **
      ** After seeking the cursor, the vdbe executes an OP_ResultRow.
      ** Code external to the Vdbe then "borrows" the b-tree cursor and
      ** uses it to implement the blob_read(), blob_write() and 
      ** blob_bytes() functions.
      **
      ** The sqlite3_blob_close() function finalizes the vdbe program,
      ** which closes the b-tree cursor and (possibly) commits the 
      ** transaction.
      */
      static const int iLn = VDBE_OFFSET_LINENO(2);
      static const VdbeOpList openBlob[] = {
        {OP_TableLock,      0, 0, 0},  /* 0: Acquire a read or write lock */
        {OP_OpenRead,       0, 0, 0},  /* 1: Open a cursor */
        /* blobSeekToRow() will initialize r[1] to the desired rowid */
        {OP_NotExists,      0, 5, 1},  /* 2: Seek the cursor to rowid=r[1] */
        {OP_Column,         0, 0, 1},  /* 3  */
        {OP_ResultRow,      1, 0, 0},  /* 4  */
        {OP_Halt,           0, 0, 0},  /* 5  */
      };
      Vdbe *v = (Vdbe *)pBlob->pStmt;
      int iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
      VdbeOp *aOp;

      sqlite3VdbeAddOp4Int(v, OP_Transaction, iDb, wrFlag, 
                           pTab->pSchema->schema_cookie,
                           pTab->pSchema->iGeneration);
      sqlite3VdbeChangeP5(v, 1);     
      aOp = sqlite3VdbeAddOpList(v, ArraySize(openBlob), openBlob, iLn);

      /* Make sure a mutex is held on the table to be accessed */
      sqlite3VdbeUsesBtree(v, iDb); 

      if( db->mallocFailed==0 ){
        assert( aOp!=0 );
        /* Configure the OP_TableLock instruction */
#ifdef SQLITE_OMIT_SHARED_CACHE
        aOp[0].opcode = OP_Noop;
#else
        aOp[0].p1 = iDb;
        aOp[0].p2 = pTab->tnum;
        aOp[0].p3 = wrFlag;
        sqlite3VdbeChangeP4(v, 1, pTab->zName, P4_TRANSIENT);
      }
      if( db->mallocFailed==0 ){
#endif

        /* Remove either the OP_OpenWrite or OpenRead. Set the P2 
        ** parameter of the other to pTab->tnum.  */
        if( wrFlag ) aOp[1].opcode = OP_OpenWrite;
        aOp[1].p2 = pTab->tnum;
        aOp[1].p3 = iDb;   

        /* Configure the number of columns. Configure the cursor to
        ** think that the table has one more column than it really
        ** does. An OP_Column to retrieve this imaginary column will
        ** always return an SQL NULL. This is useful because it means
        ** we can invoke OP_Column to fill in the vdbe cursors type 
        ** and offset cache without causing any IO.
        */
        aOp[1].p4type = P4_INT32;
        aOp[1].p4.i = pTab->nCol+1;
        aOp[3].p2 = pTab->nCol;

        pParse->nVar = 0;
        pParse->nMem = 1;
        pParse->nTab = 1;
        sqlite3VdbeMakeReady(v, pParse);
      }
    }
   
    pBlob->iCol = iCol;
    pBlob->db = db;
    sqlite3BtreeLeaveAll(db);
    if( db->mallocFailed ){
      goto blob_open_out;
    }
    rc = blobSeekToRow(pBlob, iRow, &zErr);
  } while( (++nAttempt)<SQLITE_MAX_SCHEMA_RETRY && rc==SQLITE_SCHEMA );

blob_open_out:
  if( rc==SQLITE_OK && db->mallocFailed==0 ){
    *ppBlob = (sqlite3_blob *)pBlob;
  }else{
    if( pBlob && pBlob->pStmt ) sqlite3VdbeFinalize((Vdbe *)pBlob->pStmt);
    sqlite3DbFree(db, pBlob);
  }
  sqlite3ErrorWithMsg(db, rc, (zErr ? "%s" : 0), zErr);
  sqlite3DbFree(db, zErr);
  sqlite3ParserReset(pParse);
  sqlite3StackFree(db, pParse);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}